

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

int nn_symbol_info(int i,nn_symbol_properties *buf,int buflen)

{
  int iVar1;
  
  iVar1 = 0;
  if ((uint)i < 0x78) {
    iVar1 = 0x20;
    if (buflen < 0x20) {
      iVar1 = buflen;
    }
    memcpy(buf,sym_value_names + (uint)i,(long)iVar1);
  }
  return iVar1;
}

Assistant:

int nn_symbol_info (int i, struct nn_symbol_properties *buf, int buflen)
{
    if (i < 0 || i >= SYM_VALUE_NAMES_LEN) {
        return 0;
    }
    if (buflen > (int)sizeof (struct nn_symbol_properties)) {
        buflen = (int)sizeof (struct nn_symbol_properties);
    }
    memcpy(buf, &sym_value_names [i], buflen);
    return buflen;
}